

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

_Bool nng_stat_bool(nng_stat *stat)

{
  return (stat->s_val).sv_bool;
}

Assistant:

bool
nng_stat_bool(const nng_stat *stat)
{
#if NNG_ENABLE_STATS
	return (stat->s_val.sv_bool);
#else
	NNI_ARG_UNUSED(stat);
	return (false);
#endif
}